

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.c
# Opt level: O3

stumpless_target * stumpless_set_destination(stumpless_target *target,char *destination)

{
  network_target *target_00;
  char *__ptr;
  char *pcVar1;
  
  if (target == (stumpless_target *)0x0) {
    pcVar1 = "target was NULL";
  }
  else {
    if (destination != (char *)0x0) {
      pcVar1 = copy_cstring(destination);
      if (pcVar1 == (char *)0x0) {
        return (stumpless_target *)0x0;
      }
      lock_target(target);
      if (target->type != STUMPLESS_NETWORK_TARGET) {
        raise_target_incompatible("destination is only valid for network targets");
        unlock_target(target);
        free_mem(pcVar1);
        return (stumpless_target *)0x0;
      }
      target_00 = (network_target *)target->id;
      __ptr = target_00->destination;
      target_00->destination = pcVar1;
      clear_error();
      reopen_network_target(target_00);
      unlock_target(target);
      free_mem(__ptr);
      return target;
    }
    pcVar1 = "destination was NULL";
  }
  raise_argument_empty(pcVar1);
  return (stumpless_target *)0x0;
}

Assistant:

struct stumpless_target *
stumpless_set_destination( struct stumpless_target *target,
                           const char *destination ) {
  const char *destination_copy;
  struct network_target *net_target;
  const char *old_destination;

  VALIDATE_ARG_NOT_NULL( target );
  VALIDATE_ARG_NOT_NULL( destination );

  destination_copy = copy_cstring( destination );
  if( !destination_copy ) {
    return NULL;
  }

  lock_target( target );
  if( target->type != STUMPLESS_NETWORK_TARGET ) {
    raise_target_incompatible( L10N_DESTINATION_NETWORK_ONLY_ERROR_MESSAGE );
    goto cleanup_and_fail;
  }

  net_target = target->id;
  old_destination = net_target->destination;
  net_target->destination = destination_copy;
  clear_error(  );

  reopen_network_target( net_target );

  unlock_target( target );
  free_mem( old_destination );
  return target;

cleanup_and_fail:
  unlock_target( target );
  free_mem( destination_copy );
  return NULL;
}